

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_block.cc
# Opt level: O0

void __thiscall Funcdata::pushBranch(Funcdata *this,BlockBasic *bb,int4 slot,BlockBasic *bbnew)

{
  int iVar1;
  OpCode OVar2;
  int4 iVar3;
  undefined4 extraout_var;
  LowlevelError *pLVar4;
  allocator local_91;
  string local_90 [32];
  PcodeOp *local_70;
  PcodeOp *indop;
  allocator local_51;
  string local_50 [32];
  PcodeOp *local_30;
  PcodeOp *cbranch;
  BlockBasic *bbnew_local;
  BlockBasic *pBStack_18;
  int4 slot_local;
  BlockBasic *bb_local;
  Funcdata *this_local;
  
  cbranch = (PcodeOp *)bbnew;
  bbnew_local._4_4_ = slot;
  pBStack_18 = bb;
  bb_local = (BlockBasic *)this;
  iVar1 = (*(bb->super_FlowBlock)._vptr_FlowBlock[0xe])();
  local_30 = (PcodeOp *)CONCAT44(extraout_var,iVar1);
  OVar2 = PcodeOp::code(local_30);
  if (OVar2 == CPUI_CBRANCH) {
    iVar3 = FlowBlock::sizeOut(&pBStack_18->super_FlowBlock);
    if (iVar3 == 2) {
      local_70 = (PcodeOp *)(**(code **)&cbranch->opcode[1].field_0x28)();
      OVar2 = PcodeOp::code(local_70);
      if (OVar2 != CPUI_BRANCHIND) {
        pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"Can only push branch into indirect jump",&local_91);
        LowlevelError::LowlevelError(pLVar4,(string *)local_90);
        __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      opRemoveInput(this,local_30,1);
      opSetOpcode(this,local_30,CPUI_BRANCH);
      BlockGraph::moveOutEdge
                (&this->bblocks,&pBStack_18->super_FlowBlock,bbnew_local._4_4_,(FlowBlock *)cbranch)
      ;
      structureReset(this);
      return;
    }
  }
  indop._3_1_ = 1;
  pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Cannot push non-conditional edge",&local_51);
  LowlevelError::LowlevelError(pLVar4,(string *)local_50);
  indop._3_1_ = 0;
  __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void Funcdata::pushBranch(BlockBasic *bb,int4 slot,BlockBasic *bbnew)

{
  PcodeOp *cbranch = bb->lastOp();
  if ((cbranch->code() != CPUI_CBRANCH)||(bb->sizeOut() != 2))
    throw LowlevelError("Cannot push non-conditional edge");
  PcodeOp *indop = bbnew->lastOp();
  if (indop->code() != CPUI_BRANCHIND)
    throw LowlevelError("Can only push branch into indirect jump");

  // Turn the conditional branch into a branch
  opRemoveInput(cbranch,1);	// Remove the conditional variable
  opSetOpcode(cbranch,CPUI_BRANCH);
  bblocks.moveOutEdge(bb,slot,bbnew);
  // No change needs to be made to the indirect branch
  // we assume it handles its new branch implicitly
  structureReset();
}